

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  pointer this_00;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  reference ppcVar5;
  cmMakefile *this_01;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar6;
  string *psVar7;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x_00;
  char *pcVar8;
  reference ppcVar9;
  cmSourceGroup *this_02;
  pointer pcVar10;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x_01;
  reference ppcVar11;
  char *local_328;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  string linkName4;
  string fullPath;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_250;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_248;
  const_iterator fileIt;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_220;
  undefined1 local_200 [8];
  string linkName3;
  __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_1d8;
  iterator sgIt;
  cmSourceGroup *sourceGroup;
  string source;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_198;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_190;
  const_iterator sfIt;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  cmGeneratorTarget *gt;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_100;
  char *local_e0;
  char *prefix;
  string linkName2;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_b0;
  const_iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_80;
  const_iterator lgIt;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string linkName;
  cmGeneratedFileStream *fout_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  linkName.field_2._8_8_ = fout;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"[Targets]",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = linkName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"virtual:/virtual",(allocator *)((long)&lgIt._M_current + 7));
  AppendLinkedResource((cmGeneratedFileStream *)uVar1,(string *)local_38,&local_70,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lgIt._M_current + 7));
  pvVar4 = cmGlobalGenerator::GetLocalGenerators
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_80._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar4);
  while( true ) {
    pvVar4 = cmGlobalGenerator::GetLocalGenerators
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar4);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar2) break;
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_80);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar5);
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_80);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar5);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x);
    local_b0._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      linkName2.field_2._8_8_ =
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      bVar2 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)((long)&linkName2.field_2 + 8));
      if (!bVar2) break;
      std::__cxx11::string::string((string *)&prefix,(string *)local_38);
      std::__cxx11::string::operator+=((string *)&prefix,"/");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      TVar3 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar3 < UTILITY) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_b0);
        TVar3 = cmGeneratorTarget::GetType(*ppcVar6);
        if (TVar3 == EXECUTABLE) {
          local_328 = "[exe] ";
        }
        else {
          local_328 = "[lib] ";
        }
        local_e0 = local_328;
        std::__cxx11::string::operator+=((string *)&prefix,local_328);
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_b0);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        std::__cxx11::string::operator+=((string *)&prefix,(string *)psVar7);
        uVar1 = linkName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_100,"virtual:/virtual",
                   (allocator *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        AppendLinkedResource
                  ((cmGeneratedFileStream *)uVar1,(string *)&prefix,&local_100,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        if ((this->GenerateLinkedResources & 1U) != 0) {
          __x_00 = cmMakefile::GetSourceGroups(this_01);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt,__x_00);
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_b0);
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar6;
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          this_00 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_180,"CMAKE_BUILD_TYPE",
                     (allocator *)((long)&sfIt._M_current + 7));
          pcVar8 = cmMakefile::GetSafeDefinition(this_01,&local_180);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_160,pcVar8,(allocator *)((long)&sfIt._M_current + 6));
          cmGeneratorTarget::GetSourceFiles
                    ((cmGeneratorTarget *)this_00,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140,&local_160
                    );
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 6));
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 7));
          local_198._M_current =
               (cmSourceFile **)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          __gnu_cxx::
          __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          ::__normal_iterator<cmSourceFile**>
                    ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                      *)&local_190,&local_198);
          while( true ) {
            source.field_2._8_8_ =
                 std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                           ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
            bVar2 = __gnu_cxx::operator!=
                              (&local_190,
                               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                *)((long)&source.field_2 + 8));
            if (!bVar2) break;
            ppcVar9 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_190);
            psVar7 = cmSourceFile::GetFullPath(*ppcVar9,(string *)0x0);
            std::__cxx11::string::string((string *)&sourceGroup,(string *)psVar7);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            this_02 = cmMakefile::FindSourceGroup
                                (this_01,pcVar8,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
            ppcVar9 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_190);
            cmSourceGroup::AssignSource(this_02,*ppcVar9);
            std::__cxx11::string::~string((string *)&sourceGroup);
            sgIt._M_current =
                 (cmSourceGroup *)
                 __gnu_cxx::
                 __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                 ::operator++(&local_190,0);
          }
          local_1d8._M_current =
               (cmSourceGroup *)
               std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                         ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
          while( true ) {
            linkName3.field_2._8_8_ =
                 std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end
                           ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
            bVar2 = __gnu_cxx::operator!=
                              (&local_1d8,
                               (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                *)((long)&linkName3.field_2 + 8));
            if (!bVar2) break;
            std::__cxx11::string::string((string *)local_200,(string *)&prefix);
            std::__cxx11::string::operator+=((string *)local_200,"/");
            pcVar10 = __gnu_cxx::
                      __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                      ::operator->(&local_1d8);
            pcVar8 = cmSourceGroup::GetFullName(pcVar10);
            std::__cxx11::string::operator+=((string *)local_200,pcVar8);
            uVar1 = linkName.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_220,"virtual:/virtual",
                       (allocator *)
                       ((long)&sFiles.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            AppendLinkedResource
                      ((cmGeneratedFileStream *)uVar1,(string *)local_200,&local_220,VirtualFolder);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&sFiles.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pcVar10 = __gnu_cxx::
                      __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                      ::operator->(&local_1d8);
            __x_01 = cmSourceGroup::GetSourceFiles(pcVar10);
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &fileIt,__x_01);
            local_250._M_current =
                 (cmSourceFile **)
                 std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                           ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &fileIt);
            __gnu_cxx::
            __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
            ::__normal_iterator<cmSourceFile_const**>
                      ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                        *)&local_248,&local_250);
            while( true ) {
              fullPath.field_2._8_8_ =
                   std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                             ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *
                              )&fileIt);
              bVar2 = __gnu_cxx::operator!=
                                (&local_248,
                                 (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                  *)((long)&fullPath.field_2 + 8));
              if (!bVar2) break;
              ppcVar11 = __gnu_cxx::
                         __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                         ::operator*(&local_248);
              psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar11);
              std::__cxx11::string::string
                        ((string *)(linkName4.field_2._M_local_buf + 8),(string *)psVar7);
              bVar2 = cmsys::SystemTools::FileIsDirectory((string *)((long)&linkName4.field_2 + 8));
              if (!bVar2) {
                std::__cxx11::string::string((string *)local_298,(string *)local_200);
                std::__cxx11::string::operator+=((string *)local_298,"/");
                cmsys::SystemTools::GetFilenameName
                          (&local_2b8,(string *)((long)&linkName4.field_2 + 8));
                std::__cxx11::string::operator+=((string *)local_298,(string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
                uVar1 = linkName.field_2._8_8_;
                GetEclipsePath(&local_2d8,(string *)((long)&linkName4.field_2 + 8));
                AppendLinkedResource
                          ((cmGeneratedFileStream *)uVar1,(string *)local_298,&local_2d8,LinkToFile)
                ;
                std::__cxx11::string::~string((string *)&local_2d8);
                std::__cxx11::string::~string((string *)local_298);
              }
              std::__cxx11::string::~string((string *)(linkName4.field_2._M_local_buf + 8));
              __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator++(&local_248);
            }
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &fileIt);
            std::__cxx11::string::~string((string *)local_200);
            __gnu_cxx::
            __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
            ::operator++(&local_1d8);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_b0);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_80);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
        (*lgIt)->GetGeneratorTargets();

    for(std::vector<cmGeneratorTarget*>::const_iterator ti=targets.begin();
        ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          const char* prefix = ((*ti)->GetType()==cmState::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           this->GetEclipsePath(fullPath),
                                           LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}